

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::storage16BitAssignmentCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,char *op)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtFloat16);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                (this,loc,op,"can\'t use with structs containing float16");
    }
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                (this,loc,op,"can\'t use with arrays containing float16");
    }
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtInt16);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,op,"can\'t use with structs containing int16");
    }
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 6) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,op,"can\'t use with arrays containing int16");
    }
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtUint16);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,op,"can\'t use with structs containing uint16");
    }
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 7) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,op,"can\'t use with arrays containing uint16");
    }
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtInt8);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,op,"can\'t use with structs containing int8");
    }
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,op,"can\'t use with arrays containing int8");
    }
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtUint8);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,op,"can\'t use with structs containing uint8");
    }
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,op,"can\'t use with arrays containing uint8");
      return;
    }
  }
  return;
}

Assistant:

void TParseContext::storage16BitAssignmentCheck(const TSourceLoc& loc, const TType& type, const char* op)
{
    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtFloat16))
        requireFloat16Arithmetic(loc, op, "can't use with structs containing float16");

    if (type.isArray() && type.getBasicType() == EbtFloat16)
        requireFloat16Arithmetic(loc, op, "can't use with arrays containing float16");

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtInt16))
        requireInt16Arithmetic(loc, op, "can't use with structs containing int16");

    if (type.isArray() && type.getBasicType() == EbtInt16)
        requireInt16Arithmetic(loc, op, "can't use with arrays containing int16");

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtUint16))
        requireInt16Arithmetic(loc, op, "can't use with structs containing uint16");

    if (type.isArray() && type.getBasicType() == EbtUint16)
        requireInt16Arithmetic(loc, op, "can't use with arrays containing uint16");

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtInt8))
        requireInt8Arithmetic(loc, op, "can't use with structs containing int8");

    if (type.isArray() && type.getBasicType() == EbtInt8)
        requireInt8Arithmetic(loc, op, "can't use with arrays containing int8");

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtUint8))
        requireInt8Arithmetic(loc, op, "can't use with structs containing uint8");

    if (type.isArray() && type.getBasicType() == EbtUint8)
        requireInt8Arithmetic(loc, op, "can't use with arrays containing uint8");
}